

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>,false>
               (HighsDomainChange *begin,long end,int param_3,uint param_4)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  HighsDomainChange *pHVar4;
  double dVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  HighsInt HVar9;
  HighsBoundType HVar10;
  HighsInt HVar11;
  HighsBoundType HVar12;
  bool bVar13;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  _Var14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 *puVar18;
  HighsDomainChange *pHVar19;
  ulong uVar20;
  pair<__gnu_cxx::__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>,_bool>
  pVar21;
  int local_50;
  uint local_4c;
  
  puVar1 = (undefined8 *)(end + -0x10);
  puVar2 = (undefined8 *)(end + -0x20);
  puVar3 = (undefined8 *)(end + -0x30);
  local_4c = param_4;
  local_50 = param_3;
  do {
    while( true ) {
      uVar17 = end - (long)begin >> 4;
      if ((long)uVar17 < 0x18) {
        if ((local_4c & 1) == 0) {
          unguarded_insertion_sort<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                    (begin,end);
          return;
        }
        insertion_sort<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                  (begin,end);
        return;
      }
      uVar20 = uVar17 >> 1;
      pHVar4 = begin + uVar20;
      if (uVar17 < 0x81) {
        sort3<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                  (pHVar4,begin,puVar1);
      }
      else {
        sort3<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                  (begin,pHVar4,puVar1);
        sort3<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                  (begin + 1,begin + (uVar20 - 1),puVar2);
        sort3<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                  (begin + 2,begin + uVar20 + 1,puVar3);
        sort3<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                  (begin + (uVar20 - 1),pHVar4,begin + uVar20 + 1);
        dVar5 = begin->boundval;
        HVar11 = begin->column;
        HVar12 = begin->boundtype;
        HVar9 = pHVar4->column;
        HVar10 = pHVar4->boundtype;
        begin->boundval = pHVar4->boundval;
        begin->column = HVar9;
        begin->boundtype = HVar10;
        pHVar4->boundval = dVar5;
        pHVar4->column = HVar11;
        pHVar4->boundtype = HVar12;
      }
      if (((local_4c & 1) != 0) || (bVar13 = HighsDomainChange::operator<(begin + -1,begin), bVar13)
         ) break;
      _Var14 = partition_left<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                         (begin,end);
      begin = _Var14._M_current + 1;
    }
    pVar21 = partition_right<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                       (begin,end);
    _Var14 = pVar21.first._M_current;
    uVar16 = (long)_Var14._M_current - (long)begin >> 4;
    pHVar4 = _Var14._M_current + 1;
    uVar20 = end - (long)pHVar4 >> 4;
    if (((long)uVar16 < (long)(uVar17 >> 3)) || ((long)uVar20 < (long)(uVar17 >> 3))) {
      local_50 = local_50 + -1;
      if (local_50 == 0) {
        std::
        make_heap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                  (begin,end);
        std::
        sort_heap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                  (begin,end);
        return;
      }
      if (0x17 < (long)uVar16) {
        uVar17 = uVar16 >> 2;
        dVar5 = begin->boundval;
        HVar11 = begin->column;
        HVar12 = begin->boundtype;
        pHVar19 = begin + uVar17;
        HVar9 = pHVar19->column;
        HVar10 = pHVar19->boundtype;
        begin->boundval = pHVar19->boundval;
        begin->column = HVar9;
        begin->boundtype = HVar10;
        pHVar19 = begin + uVar17;
        pHVar19->boundval = dVar5;
        pHVar19->column = HVar11;
        pHVar19->boundtype = HVar12;
        pHVar19 = _Var14._M_current + -uVar17;
        dVar5 = _Var14._M_current[-1].boundval;
        HVar11 = _Var14._M_current[-1].column;
        HVar12 = _Var14._M_current[-1].boundtype;
        HVar9 = pHVar19->column;
        HVar10 = pHVar19->boundtype;
        _Var14._M_current[-1].boundval = pHVar19->boundval;
        _Var14._M_current[-1].column = HVar9;
        _Var14._M_current[-1].boundtype = HVar10;
        pHVar19->boundval = dVar5;
        pHVar19->column = HVar11;
        pHVar19->boundtype = HVar12;
        if (0x80 < uVar16) {
          dVar5 = begin[1].boundval;
          HVar11 = begin[1].column;
          HVar12 = begin[1].boundtype;
          pHVar19 = begin + uVar17 + 1;
          HVar9 = pHVar19->column;
          HVar10 = pHVar19->boundtype;
          begin[1].boundval = pHVar19->boundval;
          begin[1].column = HVar9;
          begin[1].boundtype = HVar10;
          pHVar19 = begin + uVar17 + 1;
          pHVar19->boundval = dVar5;
          pHVar19->column = HVar11;
          pHVar19->boundtype = HVar12;
          dVar5 = begin[2].boundval;
          HVar11 = begin[2].column;
          HVar12 = begin[2].boundtype;
          pHVar19 = begin + uVar17 + 2;
          HVar9 = pHVar19->column;
          HVar10 = pHVar19->boundtype;
          begin[2].boundval = pHVar19->boundval;
          begin[2].column = HVar9;
          begin[2].boundtype = HVar10;
          pHVar19 = begin + uVar17 + 2;
          pHVar19->boundval = dVar5;
          pHVar19->column = HVar11;
          pHVar19->boundtype = HVar12;
          dVar5 = _Var14._M_current[-2].boundval;
          HVar11 = _Var14._M_current[-2].column;
          HVar12 = _Var14._M_current[-2].boundtype;
          pHVar19 = _Var14._M_current + ~uVar17;
          HVar9 = pHVar19->column;
          HVar10 = pHVar19->boundtype;
          _Var14._M_current[-2].boundval = pHVar19->boundval;
          _Var14._M_current[-2].column = HVar9;
          _Var14._M_current[-2].boundtype = HVar10;
          pHVar19 = _Var14._M_current + ~uVar17;
          pHVar19->boundval = dVar5;
          pHVar19->column = HVar11;
          pHVar19->boundtype = HVar12;
          dVar5 = _Var14._M_current[-3].boundval;
          HVar11 = _Var14._M_current[-3].column;
          HVar12 = _Var14._M_current[-3].boundtype;
          pHVar19 = _Var14._M_current + (-2 - uVar17);
          HVar9 = pHVar19->column;
          HVar10 = pHVar19->boundtype;
          _Var14._M_current[-3].boundval = pHVar19->boundval;
          _Var14._M_current[-3].column = HVar9;
          _Var14._M_current[-3].boundtype = HVar10;
          pHVar19 = _Var14._M_current + (-2 - uVar17);
          pHVar19->boundval = dVar5;
          pHVar19->column = HVar11;
          pHVar19->boundtype = HVar12;
        }
      }
      if (0x17 < (long)uVar20) {
        uVar17 = uVar20 >> 2;
        dVar5 = pHVar4->boundval;
        HVar11 = _Var14._M_current[1].column;
        HVar12 = _Var14._M_current[1].boundtype;
        pHVar19 = _Var14._M_current + uVar17 + 1;
        HVar9 = pHVar19->column;
        HVar10 = pHVar19->boundtype;
        pHVar4->boundval = pHVar19->boundval;
        _Var14._M_current[1].column = HVar9;
        _Var14._M_current[1].boundtype = HVar10;
        pHVar19 = _Var14._M_current + uVar17 + 1;
        pHVar19->boundval = dVar5;
        pHVar19->column = HVar11;
        pHVar19->boundtype = HVar12;
        puVar18 = (undefined8 *)(end + uVar17 * -0x10);
        uVar6 = *puVar1;
        uVar7 = *(undefined8 *)(end + -8);
        uVar8 = puVar18[1];
        *puVar1 = *puVar18;
        *(undefined8 *)(end + -8) = uVar8;
        *puVar18 = uVar6;
        puVar18[1] = uVar7;
        if (0x80 < uVar20) {
          dVar5 = _Var14._M_current[2].boundval;
          HVar11 = _Var14._M_current[2].column;
          HVar12 = _Var14._M_current[2].boundtype;
          HVar9 = _Var14._M_current[uVar17 + 2].column;
          HVar10 = _Var14._M_current[uVar17 + 2].boundtype;
          _Var14._M_current[2].boundval = _Var14._M_current[uVar17 + 2].boundval;
          _Var14._M_current[2].column = HVar9;
          _Var14._M_current[2].boundtype = HVar10;
          _Var14._M_current[uVar17 + 2].boundval = dVar5;
          _Var14._M_current[uVar17 + 2].column = HVar11;
          _Var14._M_current[uVar17 + 2].boundtype = HVar12;
          dVar5 = _Var14._M_current[3].boundval;
          HVar11 = _Var14._M_current[3].column;
          HVar12 = _Var14._M_current[3].boundtype;
          HVar9 = _Var14._M_current[uVar17 + 3].column;
          HVar10 = _Var14._M_current[uVar17 + 3].boundtype;
          _Var14._M_current[3].boundval = _Var14._M_current[uVar17 + 3].boundval;
          _Var14._M_current[3].column = HVar9;
          _Var14._M_current[3].boundtype = HVar10;
          _Var14._M_current[uVar17 + 3].boundval = dVar5;
          _Var14._M_current[uVar17 + 3].column = HVar11;
          _Var14._M_current[uVar17 + 3].boundtype = HVar12;
          uVar6 = *puVar2;
          uVar7 = *(undefined8 *)(end + -0x18);
          puVar18 = (undefined8 *)(end + ~uVar17 * 0x10);
          uVar8 = puVar18[1];
          *puVar2 = *puVar18;
          *(undefined8 *)(end + -0x18) = uVar8;
          puVar18 = (undefined8 *)(end + ~uVar17 * 0x10);
          *puVar18 = uVar6;
          puVar18[1] = uVar7;
          lVar15 = (-2 - uVar17) * 0x10;
          uVar6 = *puVar3;
          uVar7 = *(undefined8 *)(end + -0x28);
          puVar18 = (undefined8 *)(end + lVar15);
          uVar8 = puVar18[1];
          *puVar3 = *puVar18;
          *(undefined8 *)(end + -0x28) = uVar8;
          puVar18 = (undefined8 *)(end + lVar15);
          *puVar18 = uVar6;
          puVar18[1] = uVar7;
        }
      }
    }
    else if (((((undefined1  [16])pVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
             (bVar13 = partial_insertion_sort<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                                 (begin,_Var14._M_current), bVar13)) &&
            (bVar13 = partial_insertion_sort<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                                (pHVar4,end), bVar13)) {
      return;
    }
    pdqsort_loop<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>,false>
              (begin,_Var14._M_current,local_50,local_4c & 1);
    local_4c = 0;
    begin = pHVar4;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }